

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O0

int generate_v3(CBB *cbb,char *str,X509V3_CTX *cnf,CBS_ASN1_TAG tag,int format,int depth)

{
  uint8_t value_00;
  int iVar1;
  CBS_ASN1_TAG CVar2;
  ASN1_OBJECT *a;
  size_t sVar3;
  ulong mask;
  uchar *data_00;
  stack_st_CONF_VALUE *sk;
  CONF_VALUE *pCVar4;
  size_t sVar5;
  bool bVar6;
  bool local_211;
  bool local_201;
  bool local_1f3;
  bool local_1f2;
  bool local_1f1;
  bool local_1d5;
  int local_1d4;
  bool local_1c3;
  bool local_1c2;
  bool local_1c1;
  CBS_ASN1_TAG local_1bc;
  CBS_ASN1_TAG local_1ac;
  uint local_1a8;
  CBS_ASN1_TAG local_1a4;
  CBS_ASN1_TAG local_1a0;
  bool local_19a;
  CONF_VALUE *conf;
  size_t i_1;
  stack_st_CONF_VALUE *section;
  int ok_5;
  uint8_t *data;
  size_t len_2;
  int ok_4;
  uint8_t *out_1;
  ASN1_BIT_STRING *pAStack_150;
  int len_1;
  ASN1_BIT_STRING *obj_3;
  ASN1_STRING *pAStack_140;
  int ok_3;
  ASN1_STRING *obj_2;
  int encoding;
  int ok_2;
  CBS value_cbs;
  int ok_1;
  ASN1_OBJECT *obj_1;
  int ok;
  uint8_t *out;
  ASN1_INTEGER *pAStack_f8;
  int len;
  ASN1_INTEGER *obj;
  undefined1 local_e8 [4];
  ASN1_BOOLEAN boolean;
  CBB child;
  size_t i;
  CBS_ASN1_TAG type;
  int has_value;
  char *value;
  CBS name;
  char *colon;
  undefined1 auStack_80 [4];
  int has_value_1;
  CBS name_1;
  char *str_old;
  CBS copy;
  undefined1 auStack_50 [7];
  uint8_t v;
  CBS modifier;
  char *comma;
  int local_30;
  int depth_local;
  int format_local;
  CBS_ASN1_TAG tag_local;
  X509V3_CTX *cnf_local;
  char *str_local;
  CBB *cbb_local;
  
  if ((tag & 0x20000000) != 0) {
    __assert_fail("(tag & CBS_ASN1_CONSTRUCTED) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                  ,0x91,
                  "int generate_v3(CBB *, const char *, const X509V3_CTX *, CBS_ASN1_TAG, int, int)"
                 );
  }
  cnf_local = (X509V3_CTX *)str;
  depth_local = tag;
  local_30 = format;
  if (0x32 < depth) {
    ERR_put_error(0xc,0,0x83,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                  ,0x93);
    return 0;
  }
  while( true ) {
    while( true ) {
      bVar6 = false;
      if ((char)cnf_local->flags != '\0') {
        iVar1 = OPENSSL_isspace((uint)(byte)cnf_local->flags);
        bVar6 = iVar1 != 0;
      }
      if (!bVar6) break;
      cnf_local = (X509V3_CTX *)((long)&cnf_local->flags + 1);
    }
    modifier.len = (size_t)strchr((char *)cnf_local,0x2c);
    if ((char *)modifier.len == (char *)0x0) break;
    CBS_init((CBS *)auStack_50,(uint8_t *)cnf_local,modifier.len - (long)cnf_local);
    while( true ) {
      str_old = (char *)_auStack_50;
      copy.data = modifier.data;
      iVar1 = CBS_get_last_u8((CBS *)&str_old,(uint8_t *)((long)&copy.len + 7));
      if ((iVar1 == 0) || (iVar1 = OPENSSL_isspace((uint)copy.len._7_1_), iVar1 == 0)) break;
      _auStack_50 = (uint8_t *)str_old;
      modifier.data = copy.data;
    }
    name_1.len = (size_t)cnf_local;
    cnf_local = (X509V3_CTX *)(modifier.len + 1);
    iVar1 = CBS_get_until_first((CBS *)auStack_50,(CBS *)auStack_80,':');
    if (iVar1 == 0) {
      _auStack_80 = _auStack_50;
      name_1.data = modifier.data;
      CBS_init((CBS *)auStack_50,(uint8_t *)0x0,0);
    }
    else {
      CBS_skip((CBS *)auStack_50,1);
    }
    iVar1 = cbs_str_equal((CBS *)auStack_80,"FORMAT");
    if ((iVar1 == 0) && (iVar1 = cbs_str_equal((CBS *)auStack_80,"FORM"), iVar1 == 0)) {
      iVar1 = cbs_str_equal((CBS *)auStack_80,"IMP");
      if ((iVar1 == 0) && (iVar1 = cbs_str_equal((CBS *)auStack_80,"IMPLICIT"), iVar1 == 0)) {
        iVar1 = cbs_str_equal((CBS *)auStack_80,"EXP");
        if ((iVar1 != 0) || (iVar1 = cbs_str_equal((CBS *)auStack_80,"EXPLICIT"), iVar1 != 0)) {
          if (depth_local != 0) {
            ERR_put_error(0xc,0,0x83,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                          ,0xdd);
            return 0;
          }
          CVar2 = parse_tag((CBS *)auStack_50);
          local_19a = false;
          if (CVar2 != 0) {
            iVar1 = generate_wrapped(cbb,(char *)cnf_local,cnf,CVar2 | 0x20000000,0,local_30,depth);
            local_19a = iVar1 != 0;
          }
          return (uint)local_19a;
        }
        iVar1 = cbs_str_equal((CBS *)auStack_80,"OCTWRAP");
        if (iVar1 != 0) {
          if (depth_local == 0) {
            local_1a0 = 4;
          }
          else {
            local_1a0 = depth_local;
          }
          iVar1 = generate_wrapped(cbb,(char *)cnf_local,cnf,local_1a0,0,local_30,depth);
          return iVar1;
        }
        iVar1 = cbs_str_equal((CBS *)auStack_80,"BITWRAP");
        if (iVar1 != 0) {
          if (depth_local == 0) {
            local_1a4 = 3;
          }
          else {
            local_1a4 = depth_local;
          }
          iVar1 = generate_wrapped(cbb,(char *)cnf_local,cnf,local_1a4,1,local_30,depth);
          return iVar1;
        }
        iVar1 = cbs_str_equal((CBS *)auStack_80,"SEQWRAP");
        if (iVar1 != 0) {
          if (depth_local == 0) {
            local_1a8 = 0x20000010;
          }
          else {
            local_1a8 = depth_local | 0x20000000;
          }
          iVar1 = generate_wrapped(cbb,(char *)cnf_local,cnf,local_1a8 | 0x20000000,0,local_30,depth
                                  );
          return iVar1;
        }
        iVar1 = cbs_str_equal((CBS *)auStack_80,"SETWRAP");
        if (iVar1 != 0) {
          if (depth_local == 0) {
            local_1ac = 0x20000011;
          }
          else {
            local_1ac = depth_local | 0x20000000;
          }
          iVar1 = generate_wrapped(cbb,(char *)cnf_local,cnf,local_1ac,0,local_30,depth);
          return iVar1;
        }
        cnf_local = (X509V3_CTX *)name_1.len;
        break;
      }
      if (depth_local != 0) {
        ERR_put_error(0xc,0,0x83,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                      ,0xd1);
        return 0;
      }
      depth_local = parse_tag((CBS *)auStack_50);
      if (depth_local == 0) {
        return 0;
      }
    }
    else {
      iVar1 = cbs_str_equal((CBS *)auStack_50,"ASCII");
      if (iVar1 == 0) {
        iVar1 = cbs_str_equal((CBS *)auStack_50,"UTF8");
        if (iVar1 == 0) {
          iVar1 = cbs_str_equal((CBS *)auStack_50,"HEX");
          if (iVar1 == 0) {
            iVar1 = cbs_str_equal((CBS *)auStack_50,"BITLIST");
            if (iVar1 == 0) {
              ERR_put_error(0xc,0,0xb6,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                            ,0xcb);
              return 0;
            }
            local_30 = 4;
          }
          else {
            local_30 = 3;
          }
        }
        else {
          local_30 = 2;
        }
      }
      else {
        local_30 = 1;
      }
    }
  }
  name.len = (size_t)strchr((char *)cnf_local,0x3a);
  bVar6 = (char *)name.len != (char *)0x0;
  if (bVar6) {
    CBS_init((CBS *)&value,(uint8_t *)cnf_local,name.len - (long)cnf_local);
    _type = (uint8_t *)(name.len + 1);
  }
  else {
    sVar3 = strlen((char *)cnf_local);
    CBS_init((CBS *)&value,(uint8_t *)cnf_local,sVar3);
    _type = "";
  }
  i._0_4_ = 0;
  for (child.u._24_8_ = 0; (ulong)child.u._24_8_ < 0x21; child.u._24_8_ = child.u._24_8_ + 1) {
    iVar1 = cbs_str_equal((CBS *)&value,generate_v3::kTypes[child.u._24_8_].name);
    if (iVar1 != 0) {
      i._0_4_ = generate_v3::kTypes[child.u._24_8_].type;
      break;
    }
  }
  if ((CBS_ASN1_TAG)i == 0) {
    ERR_put_error(0xc,0,0xb9,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                  ,0x135);
    return 0;
  }
  if (depth_local == 0) {
    local_1bc = (CBS_ASN1_TAG)i;
  }
  else {
    local_1bc = depth_local | (CBS_ASN1_TAG)i & 0x20000000;
  }
  iVar1 = CBB_add_asn1(cbb,(CBB *)local_e8,local_1bc);
  if (iVar1 == 0) {
    return 0;
  }
  if ((CBS_ASN1_TAG)i == 1) {
    if (local_30 != 1) {
      ERR_put_error(0xc,0,0xa1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                    ,0x14a);
      return 0;
    }
    iVar1 = X509V3_bool_from_string((char *)_type,(ASN1_BOOLEAN *)((long)&obj + 4));
    if (iVar1 == 0) {
      ERR_put_error(0xc,0,0x7d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                    ,0x14f);
      return 0;
    }
    value_00 = '\0';
    if (obj._4_4_ != 0) {
      value_00 = 0xff;
    }
    iVar1 = CBB_add_u8((CBB *)local_e8,value_00);
    local_1c1 = false;
    if (iVar1 != 0) {
      iVar1 = CBB_flush(cbb);
      local_1c1 = iVar1 != 0;
    }
    return (uint)local_1c1;
  }
  if ((CBS_ASN1_TAG)i == 2) {
LAB_004c4e8f:
    if (local_30 == 1) {
      pAStack_f8 = s2i_ASN1_INTEGER((X509V3_EXT_METHOD *)0x0,(char *)_type);
      if (pAStack_f8 == (ASN1_INTEGER *)0x0) {
        ERR_put_error(0xc,0,0x82,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                      ,0x15d);
        cbb_local._4_4_ = 0;
      }
      else {
        out._4_4_ = i2c_ASN1_INTEGER(pAStack_f8,(uchar **)0x0);
        local_1c2 = false;
        if (0 < out._4_4_) {
          iVar1 = CBB_add_space((CBB *)local_e8,(uint8_t **)&stack0xfffffffffffffef8,(long)out._4_4_
                               );
          local_1c2 = false;
          if (iVar1 != 0) {
            iVar1 = i2c_ASN1_INTEGER(pAStack_f8,(uchar **)&stack0xfffffffffffffef8);
            local_1c2 = false;
            if (iVar1 == out._4_4_) {
              iVar1 = CBB_flush(cbb);
              local_1c2 = iVar1 != 0;
            }
          }
        }
        cbb_local._4_4_ = (uint)local_1c2;
        ASN1_INTEGER_free(pAStack_f8);
      }
    }
    else {
      ERR_put_error(0xc,0,0x8b,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                    ,0x158);
      cbb_local._4_4_ = 0;
    }
  }
  else {
    if ((CBS_ASN1_TAG)i == 3) {
      if (local_30 == 4) {
        pAStack_150 = ASN1_BIT_STRING_new();
        if (pAStack_150 == (ASN1_BIT_STRING *)0x0) {
          return 0;
        }
        iVar1 = CONF_parse_list((char *)_type,0x2c,1,bitstr_cb,pAStack_150);
        if (iVar1 == 0) {
          ERR_put_error(0xc,0,0x97,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                        ,0x1b3);
          ASN1_BIT_STRING_free(pAStack_150);
          return 0;
        }
        out_1._4_4_ = i2c_ASN1_BIT_STRING(pAStack_150,(uchar **)0x0);
        local_1f2 = false;
        if (0 < out_1._4_4_) {
          iVar1 = CBB_add_space((CBB *)local_e8,(uint8_t **)&stack0xfffffffffffffea0,
                                (long)out_1._4_4_);
          local_1f2 = false;
          if (iVar1 != 0) {
            iVar1 = i2c_ASN1_BIT_STRING(pAStack_150,(uchar **)&stack0xfffffffffffffea0);
            local_1f2 = false;
            if (iVar1 == out_1._4_4_) {
              iVar1 = CBB_flush(cbb);
              local_1f2 = iVar1 != 0;
            }
          }
        }
        len_2._4_4_ = (uint)local_1f2;
        ASN1_BIT_STRING_free(pAStack_150);
        return len_2._4_4_;
      }
      iVar1 = CBB_add_u8((CBB *)local_e8,'\0');
      if (iVar1 == 0) {
        return 0;
      }
    }
    else if ((CBS_ASN1_TAG)i != 4) {
      if ((CBS_ASN1_TAG)i == 5) {
        if (*_type != '\0') {
          ERR_put_error(0xc,0,0x85,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                        ,0x143);
          return 0;
        }
        iVar1 = CBB_flush(cbb);
        return iVar1;
      }
      if ((CBS_ASN1_TAG)i == 6) {
        if (local_30 != 1) {
          ERR_put_error(0xc,0,0xa5,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                        ,0x16b);
          return 0;
        }
        a = OBJ_txt2obj((char *)_type,0);
        if ((a != (ASN1_OBJECT *)0x0) && (a->length != 0)) {
          iVar1 = CBB_add_bytes((CBB *)local_e8,a->data,(long)a->length);
          local_1c3 = false;
          if (iVar1 != 0) {
            iVar1 = CBB_flush(cbb);
            local_1c3 = iVar1 != 0;
          }
          value_cbs.len._4_4_ = (uint)local_1c3;
          ASN1_OBJECT_free(a);
          return value_cbs.len._4_4_;
        }
        ERR_put_error(0xc,0,0x86,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                      ,0x170);
        return 0;
      }
      if ((CBS_ASN1_TAG)i != 10) {
        if ((((CBS_ASN1_TAG)i != 0xc) && (1 < (CBS_ASN1_TAG)i - 0x13)) && ((CBS_ASN1_TAG)i != 0x16))
        {
          if ((CBS_ASN1_TAG)i - 0x17 < 2) {
            if (local_30 != 1) {
              ERR_put_error(0xc,0,0xb0,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                            ,0x17b);
              return 0;
            }
            sVar3 = strlen((char *)_type);
            CBS_init((CBS *)&encoding,_type,sVar3);
            if ((CBS_ASN1_TAG)i == 0x17) {
              local_1d4 = CBS_parse_utc_time((CBS *)&encoding,(tm *)0x0,0);
            }
            else {
              local_1d4 = CBS_parse_generalized_time((CBS *)&encoding,(tm *)0x0,0);
            }
            obj_2._4_4_ = local_1d4;
            if (local_1d4 == 0) {
              ERR_put_error(0xc,0,0x8a,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                            ,0x186);
              return 0;
            }
            sVar3 = strlen((char *)_type);
            iVar1 = CBB_add_bytes((CBB *)local_e8,_type,sVar3);
            local_1d5 = false;
            if (iVar1 != 0) {
              iVar1 = CBB_flush(cbb);
              local_1d5 = iVar1 != 0;
            }
            return (uint)local_1d5;
          }
          if (((CBS_ASN1_TAG)i != 0x1c) && ((CBS_ASN1_TAG)i != 0x1e)) {
            if (1 < (CBS_ASN1_TAG)i + 0xdffffff0) {
              ERR_put_error(0xc,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                            ,0x1fe);
              return 0;
            }
            if (bVar6) {
              if (cnf == (X509V3_CTX *)0x0) {
                ERR_put_error(0xc,0,0xaa,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                              ,0x1e0);
                return 0;
              }
              sk = (stack_st_CONF_VALUE *)X509V3_get_section((X509V3_CTX *)cnf,(char *)_type);
              if (sk == (stack_st_CONF_VALUE *)0x0) {
                ERR_put_error(0xc,0,0xaa,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                              ,0x1e5);
                return 0;
              }
              for (conf = (CONF_VALUE *)0x0; pCVar4 = (CONF_VALUE *)sk_CONF_VALUE_num(sk),
                  conf < pCVar4; conf = (CONF_VALUE *)((long)&conf->section + 1)) {
                pCVar4 = sk_CONF_VALUE_value(sk,(size_t)conf);
                iVar1 = generate_v3((CBB *)local_e8,pCVar4->value,cnf,0,1,depth + 1);
                if (iVar1 == 0) {
                  return 0;
                }
                sVar5 = CBB_len((CBB *)local_e8);
                if (0x10000 < sVar5) {
                  ERR_put_error(0xc,0,0xb1,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                                ,0x1f2);
                  return 0;
                }
              }
            }
            if ((CBS_ASN1_TAG)i == 0x20000011) {
              iVar1 = CBB_flush_asn1_set_of((CBB *)local_e8);
              local_211 = false;
              if (iVar1 != 0) {
                iVar1 = CBB_flush(cbb);
                local_211 = iVar1 != 0;
              }
              return (uint)local_211;
            }
            iVar1 = CBB_flush(cbb);
            return iVar1;
          }
        }
        if (local_30 == 1) {
          obj_2._0_4_ = 0x1001;
        }
        else {
          if (local_30 != 2) {
            ERR_put_error(0xc,0,0x7f,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                          ,0x199);
            return 0;
          }
          obj_2._0_4_ = 0x1000;
        }
        iVar1 = (int)obj_2;
        pAStack_140 = (ASN1_STRING *)0x0;
        mask = ASN1_tag2bit((CBS_ASN1_TAG)i);
        iVar1 = ASN1_mbstring_ncopy(&stack0xfffffffffffffec0,_type,-1,iVar1,mask,0,0x10000);
        if (iVar1 < 1) {
          return 0;
        }
        iVar1 = CBB_add_bytes((CBB *)local_e8,pAStack_140->data,(long)pAStack_140->length);
        local_1f1 = false;
        if (iVar1 != 0) {
          iVar1 = CBB_flush(cbb);
          local_1f1 = iVar1 != 0;
        }
        obj_3._4_4_ = (uint)local_1f1;
        ASN1_STRING_free(pAStack_140);
        return obj_3._4_4_;
      }
      goto LAB_004c4e8f;
    }
    if (local_30 == 1) {
      sVar3 = strlen((char *)_type);
      iVar1 = CBB_add_bytes((CBB *)local_e8,_type,sVar3);
      local_1f3 = false;
      if (iVar1 != 0) {
        iVar1 = CBB_flush(cbb);
        local_1f3 = iVar1 != 0;
      }
      cbb_local._4_4_ = (uint)local_1f3;
    }
    else if (local_30 == 3) {
      data_00 = x509v3_hex_to_bytes((char *)_type,(size_t *)&data);
      if (data_00 == (uchar *)0x0) {
        ERR_put_error(0xc,0,0x80,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                      ,0x1d1);
        cbb_local._4_4_ = 0;
      }
      else {
        iVar1 = CBB_add_bytes((CBB *)local_e8,data_00,(size_t)data);
        local_201 = false;
        if (iVar1 != 0) {
          iVar1 = CBB_flush(cbb);
          local_201 = iVar1 != 0;
        }
        cbb_local._4_4_ = (uint)local_201;
        OPENSSL_free(data_00);
      }
    }
    else {
      ERR_put_error(0xc,0,0x7c,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                    ,0x1d9);
      cbb_local._4_4_ = 0;
    }
  }
  return cbb_local._4_4_;
}

Assistant:

static int generate_v3(CBB *cbb, const char *str, const X509V3_CTX *cnf,
                       CBS_ASN1_TAG tag, int format, int depth) {
  assert((tag & CBS_ASN1_CONSTRUCTED) == 0);
  if (depth > ASN1_GEN_MAX_DEPTH) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NESTED_TAGGING);
    return 0;
  }

  // Process modifiers. This function uses a mix of NUL-terminated strings and
  // |CBS|. Several functions only work with NUL-terminated strings, so we need
  // to keep track of when a slice spans the whole buffer.
  for (;;) {
    // Skip whitespace.
    while (*str != '\0' && OPENSSL_isspace((unsigned char)*str)) {
      str++;
    }

    // Modifiers end at commas.
    const char *comma = strchr(str, ',');
    if (comma == NULL) {
      break;
    }

    // Remove trailing whitespace.
    CBS modifier;
    CBS_init(&modifier, (const uint8_t *)str, comma - str);
    for (;;) {
      uint8_t v;
      CBS copy = modifier;
      if (!CBS_get_last_u8(&copy, &v) || !OPENSSL_isspace(v)) {
        break;
      }
      modifier = copy;
    }

    // Advance the string past the modifier, but save the original value. We
    // will need to rewind if this is not a recognized modifier.
    const char *str_old = str;
    str = comma + 1;

    // Each modifier is either NAME:VALUE or NAME.
    CBS name;
    int has_value = CBS_get_until_first(&modifier, &name, ':');
    if (has_value) {
      CBS_skip(&modifier, 1);  // Skip the colon.
    } else {
      name = modifier;
      CBS_init(&modifier, NULL, 0);
    }

    if (cbs_str_equal(&name, "FORMAT") || cbs_str_equal(&name, "FORM")) {
      if (cbs_str_equal(&modifier, "ASCII")) {
        format = ASN1_GEN_FORMAT_ASCII;
      } else if (cbs_str_equal(&modifier, "UTF8")) {
        format = ASN1_GEN_FORMAT_UTF8;
      } else if (cbs_str_equal(&modifier, "HEX")) {
        format = ASN1_GEN_FORMAT_HEX;
      } else if (cbs_str_equal(&modifier, "BITLIST")) {
        format = ASN1_GEN_FORMAT_BITLIST;
      } else {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_FORMAT);
        return 0;
      }
    } else if (cbs_str_equal(&name, "IMP") ||
               cbs_str_equal(&name, "IMPLICIT")) {
      if (tag != 0) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NESTED_TAGGING);
        return 0;
      }
      tag = parse_tag(&modifier);
      if (tag == 0) {
        return 0;
      }
    } else if (cbs_str_equal(&name, "EXP") ||
               cbs_str_equal(&name, "EXPLICIT")) {
      // It would actually be supportable, but OpenSSL does not allow wrapping
      // an explicit tag in an implicit tag.
      if (tag != 0) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NESTED_TAGGING);
        return 0;
      }
      tag = parse_tag(&modifier);
      return tag != 0 &&
             generate_wrapped(cbb, str, cnf, tag | CBS_ASN1_CONSTRUCTED,
                              /*padding=*/0, format, depth);
    } else if (cbs_str_equal(&name, "OCTWRAP")) {
      tag = tag == 0 ? CBS_ASN1_OCTETSTRING : tag;
      return generate_wrapped(cbb, str, cnf, tag, /*padding=*/0, format, depth);
    } else if (cbs_str_equal(&name, "BITWRAP")) {
      tag = tag == 0 ? CBS_ASN1_BITSTRING : tag;
      return generate_wrapped(cbb, str, cnf, tag, /*padding=*/1, format, depth);
    } else if (cbs_str_equal(&name, "SEQWRAP")) {
      tag = tag == 0 ? CBS_ASN1_SEQUENCE : (tag | CBS_ASN1_CONSTRUCTED);
      tag |= CBS_ASN1_CONSTRUCTED;
      return generate_wrapped(cbb, str, cnf, tag, /*padding=*/0, format, depth);
    } else if (cbs_str_equal(&name, "SETWRAP")) {
      tag = tag == 0 ? CBS_ASN1_SET : (tag | CBS_ASN1_CONSTRUCTED);
      return generate_wrapped(cbb, str, cnf, tag, /*padding=*/0, format, depth);
    } else {
      // If this was not a recognized modifier, rewind |str| to before splitting
      // on the comma. The type itself consumes all remaining input.
      str = str_old;
      break;
    }
  }

  // The final element is, like modifiers, NAME:VALUE or NAME, but VALUE spans
  // the length of the string, including any commas.
  const char *colon = strchr(str, ':');
  CBS name;
  const char *value;
  int has_value = colon != NULL;
  if (has_value) {
    CBS_init(&name, (const uint8_t *)str, colon - str);
    value = colon + 1;
  } else {
    CBS_init(&name, (const uint8_t *)str, strlen(str));
    value = "";  // Most types treat missing and empty value equivalently.
  }

  static const struct {
    const char *name;
    CBS_ASN1_TAG type;
  } kTypes[] = {
      {"BOOL", CBS_ASN1_BOOLEAN},
      {"BOOLEAN", CBS_ASN1_BOOLEAN},
      {"NULL", CBS_ASN1_NULL},
      {"INT", CBS_ASN1_INTEGER},
      {"INTEGER", CBS_ASN1_INTEGER},
      {"ENUM", CBS_ASN1_ENUMERATED},
      {"ENUMERATED", CBS_ASN1_ENUMERATED},
      {"OID", CBS_ASN1_OBJECT},
      {"OBJECT", CBS_ASN1_OBJECT},
      {"UTCTIME", CBS_ASN1_UTCTIME},
      {"UTC", CBS_ASN1_UTCTIME},
      {"GENERALIZEDTIME", CBS_ASN1_GENERALIZEDTIME},
      {"GENTIME", CBS_ASN1_GENERALIZEDTIME},
      {"OCT", CBS_ASN1_OCTETSTRING},
      {"OCTETSTRING", CBS_ASN1_OCTETSTRING},
      {"BITSTR", CBS_ASN1_BITSTRING},
      {"BITSTRING", CBS_ASN1_BITSTRING},
      {"UNIVERSALSTRING", CBS_ASN1_UNIVERSALSTRING},
      {"UNIV", CBS_ASN1_UNIVERSALSTRING},
      {"IA5", CBS_ASN1_IA5STRING},
      {"IA5STRING", CBS_ASN1_IA5STRING},
      {"UTF8", CBS_ASN1_UTF8STRING},
      {"UTF8String", CBS_ASN1_UTF8STRING},
      {"BMP", CBS_ASN1_BMPSTRING},
      {"BMPSTRING", CBS_ASN1_BMPSTRING},
      {"PRINTABLESTRING", CBS_ASN1_PRINTABLESTRING},
      {"PRINTABLE", CBS_ASN1_PRINTABLESTRING},
      {"T61", CBS_ASN1_T61STRING},
      {"T61STRING", CBS_ASN1_T61STRING},
      {"TELETEXSTRING", CBS_ASN1_T61STRING},
      {"SEQUENCE", CBS_ASN1_SEQUENCE},
      {"SEQ", CBS_ASN1_SEQUENCE},
      {"SET", CBS_ASN1_SET},
  };
  CBS_ASN1_TAG type = 0;
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTypes); i++) {
    if (cbs_str_equal(&name, kTypes[i].name)) {
      type = kTypes[i].type;
      break;
    }
  }
  if (type == 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_TAG);
    return 0;
  }

  // If there is an implicit tag, use the constructed bit from the base type.
  tag = tag == 0 ? type : (tag | (type & CBS_ASN1_CONSTRUCTED));
  CBB child;
  if (!CBB_add_asn1(cbb, &child, tag)) {
    return 0;
  }

  switch (type) {
    case CBS_ASN1_NULL:
      if (*value != '\0') {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NULL_VALUE);
        return 0;
      }
      return CBB_flush(cbb);

    case CBS_ASN1_BOOLEAN: {
      if (format != ASN1_GEN_FORMAT_ASCII) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ASCII_FORMAT);
        return 0;
      }
      ASN1_BOOLEAN boolean;
      if (!X509V3_bool_from_string(value, &boolean)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_BOOLEAN);
        return 0;
      }
      return CBB_add_u8(&child, boolean ? 0xff : 0x00) && CBB_flush(cbb);
    }

    case CBS_ASN1_INTEGER:
    case CBS_ASN1_ENUMERATED: {
      if (format != ASN1_GEN_FORMAT_ASCII) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_INTEGER_NOT_ASCII_FORMAT);
        return 0;
      }
      ASN1_INTEGER *obj = s2i_ASN1_INTEGER(NULL, value);
      if (obj == NULL) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_INTEGER);
        return 0;
      }
      int len = i2c_ASN1_INTEGER(obj, NULL);
      uint8_t *out;
      int ok = len > 0 &&  //
               CBB_add_space(&child, &out, len) &&
               i2c_ASN1_INTEGER(obj, &out) == len && CBB_flush(cbb);
      ASN1_INTEGER_free(obj);
      return ok;
    }

    case CBS_ASN1_OBJECT: {
      if (format != ASN1_GEN_FORMAT_ASCII) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_OBJECT_NOT_ASCII_FORMAT);
        return 0;
      }
      ASN1_OBJECT *obj = OBJ_txt2obj(value, /*dont_search_names=*/0);
      if (obj == NULL || obj->length == 0) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OBJECT);
        return 0;
      }
      int ok = CBB_add_bytes(&child, obj->data, obj->length) && CBB_flush(cbb);
      ASN1_OBJECT_free(obj);
      return ok;
    }

    case CBS_ASN1_UTCTIME:
    case CBS_ASN1_GENERALIZEDTIME: {
      if (format != ASN1_GEN_FORMAT_ASCII) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_TIME_NOT_ASCII_FORMAT);
        return 0;
      }
      CBS value_cbs;
      CBS_init(&value_cbs, (const uint8_t *)value, strlen(value));
      int ok = type == CBS_ASN1_UTCTIME
                   ? CBS_parse_utc_time(&value_cbs, NULL,
                                        /*allow_timezone_offset=*/0)
                   : CBS_parse_generalized_time(&value_cbs, NULL,
                                                /*allow_timezone_offset=*/0);
      if (!ok) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_TIME_VALUE);
        return 0;
      }
      return CBB_add_bytes(&child, (const uint8_t *)value, strlen(value)) &&
             CBB_flush(cbb);
    }

    case CBS_ASN1_UNIVERSALSTRING:
    case CBS_ASN1_IA5STRING:
    case CBS_ASN1_UTF8STRING:
    case CBS_ASN1_BMPSTRING:
    case CBS_ASN1_PRINTABLESTRING:
    case CBS_ASN1_T61STRING: {
      int encoding;
      if (format == ASN1_GEN_FORMAT_ASCII) {
        encoding = MBSTRING_ASC;
      } else if (format == ASN1_GEN_FORMAT_UTF8) {
        encoding = MBSTRING_UTF8;
      } else {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_FORMAT);
        return 0;
      }

      // |maxsize| is measured in code points, rather than bytes, but pass it in
      // as a loose cap so fuzzers can exit from excessively long inputs
      // earlier. This limit is not load-bearing because |ASN1_mbstring_ncopy|'s
      // output is already linear in the input.
      ASN1_STRING *obj = NULL;
      if (ASN1_mbstring_ncopy(&obj, (const uint8_t *)value, -1, encoding,
                              ASN1_tag2bit(type), /*minsize=*/0,
                              /*maxsize=*/ASN1_GEN_MAX_OUTPUT) <= 0) {
        return 0;
      }
      int ok = CBB_add_bytes(&child, obj->data, obj->length) && CBB_flush(cbb);
      ASN1_STRING_free(obj);
      return ok;
    }

    case CBS_ASN1_BITSTRING:
      if (format == ASN1_GEN_FORMAT_BITLIST) {
        ASN1_BIT_STRING *obj = ASN1_BIT_STRING_new();
        if (obj == NULL) {
          return 0;
        }
        if (!CONF_parse_list(value, ',', 1, bitstr_cb, obj)) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_LIST_ERROR);
          ASN1_BIT_STRING_free(obj);
          return 0;
        }
        int len = i2c_ASN1_BIT_STRING(obj, NULL);
        uint8_t *out;
        int ok = len > 0 &&  //
                 CBB_add_space(&child, &out, len) &&
                 i2c_ASN1_BIT_STRING(obj, &out) == len &&  //
                 CBB_flush(cbb);
        ASN1_BIT_STRING_free(obj);
        return ok;
      }

      // The other formats are the same as OCTET STRING, but with the leading
      // zero bytes.
      if (!CBB_add_u8(&child, 0)) {
        return 0;
      }
      [[fallthrough]];

    case CBS_ASN1_OCTETSTRING:
      if (format == ASN1_GEN_FORMAT_ASCII) {
        return CBB_add_bytes(&child, (const uint8_t *)value, strlen(value)) &&
               CBB_flush(cbb);
      }
      if (format == ASN1_GEN_FORMAT_HEX) {
        size_t len;
        uint8_t *data = x509v3_hex_to_bytes(value, &len);
        if (data == NULL) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_HEX);
          return 0;
        }
        int ok = CBB_add_bytes(&child, data, len) && CBB_flush(cbb);
        OPENSSL_free(data);
        return ok;
      }

      OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_BITSTRING_FORMAT);
      return 0;

    case CBS_ASN1_SEQUENCE:
    case CBS_ASN1_SET:
      if (has_value) {
        if (cnf == NULL) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_OR_SET_NEEDS_CONFIG);
          return 0;
        }
        const STACK_OF(CONF_VALUE) *section = X509V3_get_section(cnf, value);
        if (section == NULL) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_OR_SET_NEEDS_CONFIG);
          return 0;
        }
        for (size_t i = 0; i < sk_CONF_VALUE_num(section); i++) {
          const CONF_VALUE *conf = sk_CONF_VALUE_value(section, i);
          if (!generate_v3(&child, conf->value, cnf, /*tag=*/0,
                           ASN1_GEN_FORMAT_ASCII, depth + 1)) {
            return 0;
          }
          // This recursive call, by referencing |section|, is the one place
          // where |generate_v3|'s output can be super-linear in the input.
          // Check bounds here.
          if (CBB_len(&child) > ASN1_GEN_MAX_OUTPUT) {
            OPENSSL_PUT_ERROR(ASN1, ASN1_R_TOO_LONG);
            return 0;
          }
        }
      }
      if (type == CBS_ASN1_SET) {
        // The SET type here is a SET OF and must be sorted.
        return CBB_flush_asn1_set_of(&child) && CBB_flush(cbb);
      }
      return CBB_flush(cbb);

    default:
      OPENSSL_PUT_ERROR(ASN1, ERR_R_INTERNAL_ERROR);
      return 0;
  }
}